

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_WriteAfterShutdown_Test::TestBody
          (SSLVersionTest_WriteAfterShutdown_Test *this)

{
  SSL *s;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  const_iterator ppsVar4;
  BIO_METHOD *type;
  BIO *__p;
  pointer pbVar5;
  char *in_R9;
  char *local_310;
  AssertHelper local_2f0;
  Message local_2e8;
  uint local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2a8;
  Message local_2a0;
  int local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__4;
  Message local_278;
  int local_270 [2];
  undefined1 local_268 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_238;
  Message local_230;
  int local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__3;
  Message local_208;
  uint local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1c8;
  Message local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__2;
  size_t len;
  uint8_t *unused;
  Message local_188;
  int local_180;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIO> mem;
  ScopedTrace gtest_trace_3125;
  SSL *ssl;
  const_iterator __end2;
  const_iterator __begin2;
  pointer local_f0;
  initializer_list<ssl_st_*> local_e8;
  initializer_list<ssl_st_*> *local_d8;
  initializer_list<ssl_st_*> *__range2;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0 [3];
  ClientConfig local_88;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  SSLVersionTest_WriteAfterShutdown_Test *this_local;
  
  local_88.verify_hostname.field_2._M_allocated_capacity = 0;
  local_88.verify_hostname.field_2._8_8_ = 0;
  local_88.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
  local_88.verify_hostname._1_7_ = 0;
  local_88.verify_hostname._M_string_length = 0;
  local_88.servername.field_2._M_allocated_capacity = 0;
  local_88.servername.field_2._8_8_ = 0;
  local_88.servername._M_dataplus = (_Alloc_hider)0x0;
  local_88.servername._1_7_ = 0;
  local_88.servername._M_string_length = 0;
  local_88.session = (SSL_SESSION *)0x0;
  local_88.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
  local_88.hostflags = 0;
  local_88.early_data = false;
  local_88._85_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ClientConfig::ClientConfig(&local_88);
  local_21 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_88);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  ClientConfig::~ClientConfig(&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_20,(AssertionResult *)"Connect()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xc32,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(local_a0);
  }
  __range2._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (__range2._4_4_ == 0) {
    __begin2 = (const_iterator)
               std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
    local_f0 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
    local_e8._M_array = (iterator)&__begin2;
    local_e8._M_len = 2;
    local_d8 = &local_e8;
    __end2 = std::initializer_list<ssl_st_*>::begin(local_d8);
    ppsVar4 = std::initializer_list<ssl_st_*>::end(local_d8);
    for (; __end2 != ppsVar4; __end2 = __end2 + 1) {
      s = (SSL *)*__end2;
      iVar2 = SSL_is_server((SSL *)s);
      if (iVar2 == 0) {
        local_310 = "client";
      }
      else {
        local_310 = "server";
      }
      testing::ScopedTrace::ScopedTrace
                ((ScopedTrace *)
                 ((long)&mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 7),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xc35,local_310);
      type = BIO_s_mem();
      __p = BIO_new(type);
      std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,(pointer)__p);
      testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_130,
                 (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_160,(internal *)local_130,(AssertionResult *)"mem","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xc38,pcVar3);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        testing::Message::~Message(&local_138);
      }
      __range2._4_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
      if (__range2._4_4_ == 0) {
        UpRef((bssl *)&gtest_ar.message_,(UniquePtr<BIO> *)&gtest_ar__1.message_);
        pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::release
                           ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar.message_);
        SSL_set0_wbio((SSL *)s,pbVar5);
        std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar.message_);
        local_17c = SSL_shutdown(s);
        local_180 = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_178,"SSL_shutdown(ssl)","0",&local_17c,&local_180);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
        if (!bVar1) {
          testing::Message::Message(&local_188);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&unused,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc3d,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&unused,&local_188);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unused);
          testing::Message::~Message(&local_188);
        }
        __range2._4_4_ = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
        if (__range2._4_4_ == 0) {
          pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
          local_1b4 = BIO_mem_contents(pbVar5,(uint8_t **)&len,(size_t *)&gtest_ar__2.message_);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1b0,&local_1b4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
          if (!bVar1) {
            testing::Message::Message(&local_1c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_1b0,
                       (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false",
                       "true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xc42,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
            testing::internal::AssertHelper::~AssertHelper(&local_1c8);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_1c0);
          }
          __range2._4_4_ = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
          if (__range2._4_4_ == 0) {
            local_1fc = 0;
            testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
                      ((internal *)local_1f8,"0u","len",&local_1fc,
                       (unsigned_long *)&gtest_ar__2.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
            if (!bVar1) {
              testing::Message::Message(&local_208);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xc43,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__3.message_,&local_208);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
              testing::Message::~Message(&local_208);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
            pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                               );
            local_224 = BIO_reset(pbVar5);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_220,&local_224,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
            if (!bVar1) {
              testing::Message::Message(&local_230);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_2.message_,(internal *)local_220,
                         (AssertionResult *)"BIO_reset(mem.get())","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_238,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xc44,pcVar3);
              testing::internal::AssertHelper::operator=(&local_238,&local_230);
              testing::internal::AssertHelper::~AssertHelper(&local_238);
              std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
              testing::Message::~Message(&local_230);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
            local_270[1] = 0xffffffff;
            local_270[0] = SSL_write(s,"a",1);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_268,"-1","SSL_write(ssl, \"a\", 1)",local_270 + 1,local_270
                      );
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
            if (!bVar1) {
              testing::Message::Message(&local_278);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xc47,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__4.message_,&local_278);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_278);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
            pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                               );
            local_294 = BIO_mem_contents(pbVar5,(uint8_t **)&len,(size_t *)&gtest_ar__2.message_);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_290,&local_294,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
            if (!bVar1) {
              testing::Message::Message(&local_2a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_3.message_,(internal *)local_290,
                         (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false",
                         "true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xc4a,pcVar3);
              testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
              testing::internal::AssertHelper::~AssertHelper(&local_2a8);
              std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
              testing::Message::~Message(&local_2a0);
            }
            __range2._4_4_ = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
            if (__range2._4_4_ == 0) {
              local_2dc = 0;
              testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                        ((EqHelper *)local_2d8,"0u","len",&local_2dc,
                         (unsigned_long *)&gtest_ar__2.message_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
              if (!bVar1) {
                testing::Message::Message(&local_2e8);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_2f0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xc4b,pcVar3);
                testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
                testing::internal::AssertHelper::~AssertHelper(&local_2f0);
                testing::Message::~Message(&local_2e8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
              __range2._4_4_ = 0;
            }
          }
        }
      }
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      testing::ScopedTrace::~ScopedTrace
                ((ScopedTrace *)
                 ((long)&mem._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 7));
      if (__range2._4_4_ != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, WriteAfterShutdown) {
  ASSERT_TRUE(Connect());

  for (SSL *ssl : {client_.get(), server_.get()}) {
    SCOPED_TRACE(SSL_is_server(ssl) ? "server" : "client");

    bssl::UniquePtr<BIO> mem(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(mem);
    SSL_set0_wbio(ssl, bssl::UpRef(mem).release());

    // Shut down half the connection. |SSL_shutdown| will return 0 to signal
    // only one side has shut down.
    ASSERT_EQ(SSL_shutdown(ssl), 0);

    // |ssl| should have written an alert to the transport.
    const uint8_t *unused;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_NE(0u, len);
    EXPECT_TRUE(BIO_reset(mem.get()));

    // Writing should fail.
    EXPECT_EQ(-1, SSL_write(ssl, "a", 1));

    // Nothing should be written to the transport.
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_EQ(0u, len);
  }
}